

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::trySetValidIndex(QComboBoxPrivate *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  int pos;
  int rowCount;
  bool currentReset;
  QComboBox *q;
  QModelIndex idx;
  ItemFlag in_stack_ffffffffffffff6c;
  QModelIndex *this_00;
  int local_74;
  QComboBoxPrivate *mi;
  QComboBoxPrivate *in_stack_ffffffffffffffa8;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_3c;
  QPersistentModelIndex local_38 [3];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  mi = in_RDI;
  q_func(in_RDI);
  bVar2 = false;
  iVar3 = QComboBox::count((QComboBox *)in_RDI);
  local_74 = 0;
  do {
    if (iVar3 <= local_74) {
LAB_005310b1:
      if (!bVar2) {
        QModelIndex::QModelIndex((QModelIndex *)0x5310c2);
        setCurrentIndex(in_stack_ffffffffffffffa8,(QModelIndex *)mi);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QModelIndex *)in_RDI->model;
    iVar1 = in_RDI->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
    (**(code **)(*(long *)this_00 + 0x60))(&local_20,this_00,local_74,iVar1,local_38);
    QModelIndex::flags(this_00);
    local_3c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&((QFlags<Qt::ItemFlag> *)this_00,in_stack_ffffffffffffff6c);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_3c);
    if (IVar4 != 0) {
      setCurrentIndex(in_stack_ffffffffffffffa8,(QModelIndex *)mi);
      bVar2 = true;
      goto LAB_005310b1;
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

void QComboBoxPrivate::trySetValidIndex()
{
    Q_Q(QComboBox);
    bool currentReset = false;

    const int rowCount = q->count();
    for (int pos = 0; pos < rowCount; ++pos) {
        const QModelIndex idx(model->index(pos, modelColumn, root));
        if (idx.flags() & Qt::ItemIsEnabled) {
            setCurrentIndex(idx);
            currentReset = true;
            break;
        }
    }

    if (!currentReset)
        setCurrentIndex(QModelIndex());
}